

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O0

void __thiscall
OpenMD::DataHolder::assign<std::__cxx11::string>
          (DataHolder *this,string *keyword,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  ParameterBase *pPVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  ostream *poVar5;
  OpenMDException *this_00;
  string *msg;
  undefined8 uVar6;
  string *in_RDX;
  string *in_RSI;
  stringstream ss_1;
  stringstream ss;
  bool result;
  iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb98;
  key_type *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  OpenMDException *in_stack_fffffffffffffbb0;
  stringstream local_3c8 [16];
  ostream local_3b8 [376];
  _Self local_240;
  _Self local_238;
  undefined1 local_229;
  string local_208 [32];
  stringstream local_1e8 [16];
  ostream local_1d8 [392];
  string local_50 [39];
  byte local_29;
  _Self local_28;
  _Self local_20 [2];
  string *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
               *)in_stack_fffffffffffffb98,(key_type *)0x1ba692);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
              *)in_stack_fffffffffffffb98);
  bVar2 = std::operator!=(local_20,&local_28);
  if (bVar2) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                           *)0x1ba6db);
    pPVar1 = ppVar4->second;
    std::__cxx11::string::string(local_50,in_RDX);
    uVar3 = (*pPVar1->_vptr_ParameterBase[3])(pPVar1,local_50);
    std::__cxx11::string::~string(local_50);
    local_29 = (byte)uVar3 & 1;
    if ((uVar3 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1e8);
      poVar5 = std::operator<<(local_1d8,"Error in parsing ");
      poVar5 = std::operator<<(poVar5,local_10);
      poVar5 = std::operator<<(poVar5,": expected ");
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                             *)0x1ba7a2);
      (*ppVar4->second->_vptr_ParameterBase[9])(local_208);
      poVar5 = std::operator<<(poVar5,local_208);
      poVar5 = std::operator<<(poVar5," but got ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDX);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string(local_208);
      local_229 = 1;
      this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(this_00,in_stack_fffffffffffffba8);
      local_229 = 0;
      __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
  }
  else {
    local_238._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    local_240._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffb98);
    bVar2 = std::operator!=(&local_238,&local_240);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream(local_3c8);
      msg = (string *)std::operator<<(local_3b8,local_10);
      std::operator<<((ostream *)msg," is not a recognized keyword.\n");
      uVar6 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      OpenMDException::OpenMDException(in_stack_fffffffffffffbb0,msg);
      __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",uVar6);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
  }
  return;
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }